

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanLogicalDevice::VulkanLogicalDevice(VulkanLogicalDevice *this,CreateInfo *CI)

{
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *pvVar1;
  const_reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  VkAccessFlags *AccessMask;
  VkPipelineStageFlags *StageMask;
  VkQueueFamilyProperties *Queue;
  size_t q;
  VkQueueFamilyProperties *local_40;
  size_t QueueCount;
  VkAccessFlags TransferAccessMask;
  VkAccessFlags ComputeAccessMask;
  VkAccessFlags GraphicsAccessMask;
  VkPipelineStageFlags ComputeStages;
  VkPipelineStageFlags GraphicsStages;
  CreateInfo *local_18;
  CreateInfo *CI_local;
  VulkanLogicalDevice *this_local;
  
  local_18 = CI;
  CI_local = (CreateInfo *)this;
  std::enable_shared_from_this<VulkanUtilities::VulkanLogicalDevice>::enable_shared_from_this
            (&this->super_enable_shared_from_this<VulkanUtilities::VulkanLogicalDevice>);
  this->m_VkDevice = local_18->vkDevice;
  this->m_VkAllocator = local_18->vkAllocator;
  memcpy(&this->m_EnabledFeatures,local_18->EnabledFeatures,0xdc);
  memcpy(&this->m_EnabledExtFeatures,local_18->EnabledExtFeatures,0x2e0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_SupportedStagesMask);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_SupportedAccessMask);
  volkLoadDevice(this->m_VkDevice);
  GraphicsAccessMask = 0x878c;
  ComputeAccessMask = 0x802;
  TransferAccessMask = 0x796;
  QueueCount._4_4_ = 0x69;
  QueueCount._0_4_ = 0x7800;
  if ((this->m_EnabledFeatures).geometryShader != 0) {
    GraphicsAccessMask = 0x87cc;
  }
  if ((this->m_EnabledFeatures).tessellationShader != 0) {
    GraphicsAccessMask = GraphicsAccessMask | 0x30;
  }
  if (((this->m_EnabledExtFeatures).MeshShader.meshShader != 0) &&
     ((this->m_EnabledExtFeatures).MeshShader.taskShader != 0)) {
    GraphicsAccessMask = GraphicsAccessMask | 0x180000;
  }
  if ((this->m_EnabledExtFeatures).RayTracingPipeline.rayTracingPipeline != 0) {
    ComputeAccessMask = 0x2200802;
    QueueCount._4_4_ = 0x600069;
  }
  if ((this->m_EnabledExtFeatures).ShadingRate.attachmentFragmentShadingRate != 0) {
    GraphicsAccessMask = GraphicsAccessMask | 0x400000;
    TransferAccessMask = 0x800796;
  }
  if ((this->m_EnabledExtFeatures).FragmentDensityMap.fragmentDensityMap != 0) {
    GraphicsAccessMask = GraphicsAccessMask | 0x800000;
    TransferAccessMask = TransferAccessMask | 0x1000000;
  }
  pvVar1 = VulkanPhysicalDevice::GetQueueProperties(local_18->PhysicalDevice);
  local_40 = (VkQueueFamilyProperties *)
             std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::size
                       (pvVar1);
  q._4_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->m_SupportedStagesMask,(size_type)local_40,(value_type_conflict *)((long)&q + 4))
  ;
  q._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->m_SupportedAccessMask,(size_type)local_40,(value_type_conflict *)&q);
  for (Queue = (VkQueueFamilyProperties *)0x0; Queue < local_40;
      Queue = (VkQueueFamilyProperties *)((long)&Queue->queueFlags + 1)) {
    pvVar1 = VulkanPhysicalDevice::GetQueueProperties(local_18->PhysicalDevice);
    pvVar2 = std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::
             operator[](pvVar1,(size_type)Queue);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_SupportedStagesMask,(size_type)Queue);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_SupportedAccessMask,(size_type)Queue);
    if ((pvVar2->queueFlags & 1) == 0) {
      if ((pvVar2->queueFlags & 2) == 0) {
        if ((pvVar2->queueFlags & 4) != 0) {
          *pvVar3 = *pvVar3 | 0x17001;
          *pvVar4 = (uint)QueueCount | *pvVar4;
        }
      }
      else {
        *pvVar3 = ComputeAccessMask | 0x17001 | *pvVar3;
        *pvVar4 = QueueCount._4_4_ | (uint)QueueCount | *pvVar4;
      }
    }
    else {
      *pvVar3 = GraphicsAccessMask | ComputeAccessMask | 0x17001 | *pvVar3;
      *pvVar4 = TransferAccessMask | QueueCount._4_4_ | (uint)QueueCount | *pvVar4;
    }
  }
  return;
}

Assistant:

VulkanLogicalDevice::VulkanLogicalDevice(const CreateInfo& CI) :
    m_VkDevice{CI.vkDevice},
    m_VkAllocator{CI.vkAllocator},
    m_EnabledFeatures{CI.EnabledFeatures},
    m_EnabledExtFeatures{CI.EnabledExtFeatures}
{
#if DILIGENT_USE_VOLK
    // Since we only use one device at this time, load device function entries
    // https://github.com/zeux/volk#optimizing-device-calls
    volkLoadDevice(m_VkDevice);
#endif

    VkPipelineStageFlags GraphicsStages =
        VK_PIPELINE_STAGE_VERTEX_SHADER_BIT |
        VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT |
        VK_PIPELINE_STAGE_VERTEX_INPUT_BIT |
        VK_PIPELINE_STAGE_EARLY_FRAGMENT_TESTS_BIT |
        VK_PIPELINE_STAGE_LATE_FRAGMENT_TESTS_BIT |
        VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT |
        VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT;
    VkPipelineStageFlags ComputeStages =
        VK_PIPELINE_STAGE_DRAW_INDIRECT_BIT |
        VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT;

    VkAccessFlags GraphicsAccessMask =
        VK_ACCESS_INDEX_READ_BIT |
        VK_ACCESS_VERTEX_ATTRIBUTE_READ_BIT |
        VK_ACCESS_INPUT_ATTACHMENT_READ_BIT |
        VK_ACCESS_COLOR_ATTACHMENT_READ_BIT |
        VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT |
        VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_READ_BIT |
        VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT;
    VkAccessFlags ComputeAccessMask =
        VK_ACCESS_INDIRECT_COMMAND_READ_BIT |
        VK_ACCESS_UNIFORM_READ_BIT |
        VK_ACCESS_SHADER_READ_BIT |
        VK_ACCESS_SHADER_WRITE_BIT;
    VkAccessFlags TransferAccessMask =
        VK_ACCESS_TRANSFER_READ_BIT |
        VK_ACCESS_TRANSFER_WRITE_BIT |
        VK_ACCESS_HOST_READ_BIT |
        VK_ACCESS_HOST_WRITE_BIT;

    if (m_EnabledFeatures.geometryShader)
        GraphicsStages |= VK_PIPELINE_STAGE_GEOMETRY_SHADER_BIT;
    if (m_EnabledFeatures.tessellationShader)
        GraphicsStages |= VK_PIPELINE_STAGE_TESSELLATION_CONTROL_SHADER_BIT | VK_PIPELINE_STAGE_TESSELLATION_EVALUATION_SHADER_BIT;
    if (m_EnabledExtFeatures.MeshShader.meshShader != VK_FALSE && m_EnabledExtFeatures.MeshShader.taskShader != VK_FALSE)
        GraphicsStages |= VK_PIPELINE_STAGE_TASK_SHADER_BIT_EXT | VK_PIPELINE_STAGE_MESH_SHADER_BIT_EXT;
    if (m_EnabledExtFeatures.RayTracingPipeline.rayTracingPipeline != VK_FALSE)
    {
        ComputeStages |= VK_PIPELINE_STAGE_RAY_TRACING_SHADER_BIT_KHR | VK_PIPELINE_STAGE_ACCELERATION_STRUCTURE_BUILD_BIT_KHR;
        ComputeAccessMask |= VK_ACCESS_ACCELERATION_STRUCTURE_READ_BIT_KHR | VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR;
    }
    if (m_EnabledExtFeatures.ShadingRate.attachmentFragmentShadingRate != VK_FALSE)
    {
        GraphicsStages |= VK_PIPELINE_STAGE_FRAGMENT_SHADING_RATE_ATTACHMENT_BIT_KHR;
        GraphicsAccessMask |= VK_ACCESS_FRAGMENT_SHADING_RATE_ATTACHMENT_READ_BIT_KHR;
    }
    if (m_EnabledExtFeatures.FragmentDensityMap.fragmentDensityMap != VK_FALSE)
    {
        GraphicsStages |= VK_PIPELINE_STAGE_FRAGMENT_DENSITY_PROCESS_BIT_EXT;
        GraphicsAccessMask |= VK_ACCESS_FRAGMENT_DENSITY_MAP_READ_BIT_EXT;
    }

    const size_t QueueCount = CI.PhysicalDevice.GetQueueProperties().size();
    m_SupportedStagesMask.resize(QueueCount, 0);
    m_SupportedAccessMask.resize(QueueCount, 0);
    for (size_t q = 0; q < QueueCount; ++q)
    {
        const VkQueueFamilyProperties& Queue      = CI.PhysicalDevice.GetQueueProperties()[q];
        VkPipelineStageFlags&          StageMask  = m_SupportedStagesMask[q];
        VkAccessFlags&                 AccessMask = m_SupportedAccessMask[q];

        if (Queue.queueFlags & VK_QUEUE_GRAPHICS_BIT)
        {
            StageMask |= GraphicsStages | ComputeStages | VK_PIPELINE_STAGE_ALL_TRANSFER;
            AccessMask |= GraphicsAccessMask | ComputeAccessMask | TransferAccessMask;
        }
        else if (Queue.queueFlags & VK_QUEUE_COMPUTE_BIT)
        {
            StageMask |= ComputeStages | VK_PIPELINE_STAGE_ALL_TRANSFER;
            AccessMask |= ComputeAccessMask | TransferAccessMask;
        }
        else if (Queue.queueFlags & VK_QUEUE_TRANSFER_BIT)
        {
            StageMask |= VK_PIPELINE_STAGE_ALL_TRANSFER;
            AccessMask |= TransferAccessMask;
        }
    }
}